

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  pointer pbVar4;
  Text local_98;
  TextAttributes local_40;
  
  lVar2 = std::__cxx11::string::find((char *)_string,0x17476e,0);
  lVar3 = lVar2 + 2;
  if (lVar2 == -1) {
    lVar3 = 0;
  }
  poVar1 = (this->super_StreamingReporterBase).stream;
  local_40.width = 0x4f;
  local_40.tabChar = '\t';
  local_40.indent = lVar3 + indent;
  local_40.initialIndent = indent;
  Tbc::Text::Text(&local_98,_string,&local_40);
  for (pbVar4 = local_98.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 != local_98.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    if (pbVar4 != local_98.lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98.lines);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.str._M_dataplus._M_p != &local_98.str.field_2) {
    operator_delete(local_98.str._M_dataplus._M_p);
  }
  return;
}

Assistant:

void printHeaderString( std::string const& _string, std::size_t indent = 0 ) {
            std::size_t i = _string.find( ": " );
            if( i != std::string::npos )
                i+=2;
            else
                i = 0;
            stream << Text( _string, TextAttributes()
                                        .setIndent( indent+i)
                                        .setInitialIndent( indent ) ) << "\n";
        }